

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void * kv_thread(void *args)

{
  fdb_status fVar1;
  uint64_t in_RDI;
  storage_t *st;
  fdb_status status;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  uint64_t i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  storage_t *in_stack_00000d90;
  uint64_t *in_stack_000010d8;
  fdb_snapshot_info_t **in_stack_000010e0;
  fdb_file_handle *in_stack_000010e8;
  undefined4 in_stack_ffffffffffffff88;
  ulong local_68;
  ulong local_60;
  timeval local_18;
  uint64_t local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fVar1 = fdb_get_all_snap_markers(in_stack_000010e8,in_stack_000010e0,in_stack_000010d8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x493);
    kv_thread::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x493,"void *kv_thread(void *)");
    }
    fVar1 = FDB_RESULT_SUCCESS;
  }
  for (local_60 = 0; local_60 < local_68; local_60 = local_60 + 10) {
    load_persons(in_stack_00000d90);
  }
  fdb_free_snap_markers((fdb_snapshot_info_t *)CONCAT44(fVar1,in_stack_ffffffffffffff88),local_8);
  return (void *)0x0;
}

Assistant:

void *kv_thread(void *args) {
    // This thread stores and indexes person docs

    TEST_INIT();
    uint64_t i;
    uint64_t num_markers;
    fdb_snapshot_info_t *markers;
    fdb_status status;

    storage_t *st = (storage_t *)args;
    status = fdb_get_all_snap_markers(st->main, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i = 0; i < num_markers; i += 10) {
        load_persons(st);
    }
    fdb_free_snap_markers(markers, num_markers);
    return NULL;
}